

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_fixed_suite::fixed_expand_front(void)

{
  basic_iterator<int> first_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end;
  uint uVar1;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_4UL> span;
  int array [4];
  allocator_type local_79;
  vector<int,_std::allocator<int>_> local_78;
  circular_view<int,_4UL> local_60;
  circular_view<int,_4UL> *local_48;
  ulong uStack_40;
  type local_38 [6];
  int local_20 [4];
  
  local_60.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_60.member.size = 0;
  local_60.member.next = 4;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  input._M_len = 3;
  input._M_array = (iterator)&local_78;
  vista::circular_view<int,_4UL>::assign(&local_60,input);
  if (local_60.member.size == 4) {
    local_60.member.next = (ulong)((int)local_60.member.next - 1U & 3) | 4;
    local_60.member.size = 4;
  }
  else {
    local_60.member.size = local_60.member.size + 1;
  }
  local_20[0] = 0;
  local_20[1] = 0xb;
  local_20[2] = 0x16;
  local_20[3] = 0x21;
  __l._M_len = 4;
  __l._M_array = local_20;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__l,&local_79);
  first_begin.current._0_4_ = (uint)local_60.member.next - (int)local_60.member.size & 7;
  uVar1 = (uint)local_60.member.next & 7;
  uStack_40 = (ulong)uVar1;
  second_end._M_current._4_4_ =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end._M_current._0_4_ =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end.current._0_4_ = uVar1;
  first_end.parent = &local_60;
  first_end.current._4_4_ = 0;
  first_begin.parent = &local_60;
  first_begin.current._4_4_ = 0;
  local_48 = &local_60;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x412,"void api_fixed_suite::fixed_expand_front()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,second_end);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fixed_expand_front()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    span = { 11, 22, 33 };
    span.expand_front();
    {
        std::vector<int> expect = { 0, 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}